

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# restincurl.h
# Opt level: O2

void __thiscall restincurl::EasyHandle::EasyHandle(EasyHandle *this)

{
  handle_t pCVar1;
  ostream *poVar2;
  
  pCVar1 = (handle_t)curl_easy_init();
  this->handle_ = pCVar1;
  poVar2 = std::operator<<((ostream *)&std::clog,"EasyHandle created: ");
  poVar2 = std::ostream::_M_insert<void_const*>(poVar2);
  std::endl<char,std::char_traits<char>>(poVar2);
  return;
}

Assistant:

EasyHandle() {
            RESTINCURL_LOG("EasyHandle created: " << handle_);
        }